

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBlock(WasmBytecodeGenerator *this)

{
  uint label;
  WasmReaderBase *pWVar1;
  BlockInfo *blockInfo_00;
  PolymorphicEmitInfo PVar2;
  BlockInfo *blockInfo;
  ByteCodeLabel blockLabel;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo yieldInfo;
  
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  pWVar1 = GetReader(this);
  blockInfo_00 = PushLabel(this,(pWVar1->m_currentNode).field_1.block,label,true,true);
  EmitBlockCommon(this,blockInfo_00,(bool *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar2 = PopLabel(this,label);
  PVar2._4_4_ = 0;
  return PVar2;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBlock()
{
    Js::ByteCodeLabel blockLabel = m_writer->DefineLabel();

    BlockInfo* blockInfo = PushLabel(GetReader()->m_currentNode.block, blockLabel);
    EmitBlockCommon(blockInfo);
    m_writer->MarkAsmJsLabel(blockLabel);
    PolymorphicEmitInfo yieldInfo = PopLabel(blockLabel);

    // block yields last value
    return yieldInfo;
}